

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::removeChild(CGUITabControl *this,IGUIElement *child)

{
  int idx_00;
  CGUITabControl *in_RSI;
  CGUITabControl *in_RDI;
  IGUIElement *unaff_retaddr;
  s32 idx;
  CGUITabControl *child_00;
  
  child_00 = in_RDI;
  idx_00 = (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI);
  if (-1 < idx_00) {
    removeTabButNotChild(in_RSI,idx_00);
  }
  IGUIElement::removeChild(unaff_retaddr,(IGUIElement *)child_00);
  recalculateScrollBar(in_RDI);
  return;
}

Assistant:

void CGUITabControl::removeChild(IGUIElement *child)
{
	s32 idx = getTabIndex(child);
	if (idx >= 0)
		removeTabButNotChild(idx);

	// remove real element
	IGUIElement::removeChild(child);

	recalculateScrollBar();
}